

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O2

void double_conversion::FillDigits32FixedLength
               (uint32_t number,int requested_length,Vector<char> buffer,int *length)

{
  int *piVar1;
  char *pcVar2;
  int iVar3;
  
  piVar1 = buffer._8_8_;
  pcVar2 = buffer.start_ + (requested_length + -1);
  for (iVar3 = requested_length; 0 < iVar3; iVar3 = iVar3 + -1) {
    pcVar2[*piVar1] = (byte)(number % 10) | 0x30;
    pcVar2 = pcVar2 + -1;
    number = number / 10;
  }
  *piVar1 = *piVar1 + requested_length;
  return;
}

Assistant:

static void FillDigits32FixedLength(uint32_t number, int requested_length,
                                    Vector<char> buffer, int* length) {
  for (int i = requested_length - 1; i >= 0; --i) {
    buffer[(*length) + i] = '0' + number % 10;
    number /= 10;
  }
  *length += requested_length;
}